

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O2

numeric * cs::parse_number(numeric *__return_storage_ptr__,string *str)

{
  longlong lVar1;
  unkbyte10 in_ST0;
  undefined1 auVar2 [16];
  
  auVar2 = std::__cxx11::string::find((char)str,0x2e);
  if (auVar2._0_8_ == -1) {
    lVar1 = std::__cxx11::stoll(str,(size_t *)0x0,10);
    __return_storage_ptr__->type = true;
    (__return_storage_ptr__->data)._int = lVar1;
  }
  else {
    std::__cxx11::stold((longdouble *)str,(string *)0x0,auVar2._8_8_);
    __return_storage_ptr__->type = false;
    *(unkbyte10 *)&__return_storage_ptr__->data = in_ST0;
  }
  return __return_storage_ptr__;
}

Assistant:

numeric parse_number(const std::string &str)
	{
		try {
			if (str.find('.') != std::string::npos)
				return std::stold(str);
			else
				return std::stoll(str);
		}
		catch (const std::exception &e) {
			throw lang_error("Wrong literal format.");
		}
	}